

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O3

uint __thiscall BigNumber::numOfTrimCharsOnLeft(BigNumber *this,string *str)

{
  char cVar1;
  ulong uVar2;
  
  for (uVar2 = 0;
      ((cVar1 = (str->_M_dataplus)._M_p[uVar2], uVar2 < str->_M_string_length - 1 && cVar1 == '0' ||
       (cVar1 == '-')) || (cVar1 == '+')); uVar2 = uVar2 + 1) {
  }
  return (uint)uVar2;
}

Assistant:

unsigned BigNumber::numOfTrimCharsOnLeft(const std::string &str) {
    unsigned numOfChars = 0;
    size_t i = 0;
    while( i < str.size() - 1 && str[i] == '0' || str[i] == '-' || str[i] == '+'){
        ++numOfChars;
        ++i;
    }
    return numOfChars;
}